

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O2

int xmlXIncludeProcessTreeFlags(xmlNodePtr tree,int flags)

{
  int iVar1;
  xmlXIncludeCtxtPtr ctxt;
  
  iVar1 = -1;
  if (((tree != (xmlNodePtr)0x0) && (tree->type != XML_NAMESPACE_DECL)) &&
     (tree->doc != (xmlDocPtr)0x0)) {
    ctxt = xmlXIncludeNewContext(tree->doc);
    if (ctxt != (xmlXIncludeCtxtPtr)0x0) {
      ctxt->parseFlags = flags;
      iVar1 = xmlXIncludeDoProcessRoot(ctxt,tree);
      if (-1 < iVar1) {
        if (0 < ctxt->nbErrors) {
          iVar1 = -1;
        }
      }
      xmlXIncludeFreeContext(ctxt);
    }
  }
  return iVar1;
}

Assistant:

int
xmlXIncludeProcessTreeFlags(xmlNodePtr tree, int flags) {
    xmlXIncludeCtxtPtr ctxt;
    int ret = 0;

    if ((tree == NULL) || (tree->type == XML_NAMESPACE_DECL) ||
        (tree->doc == NULL))
	return(-1);
    ctxt = xmlXIncludeNewContext(tree->doc);
    if (ctxt == NULL)
	return(-1);
    xmlXIncludeSetFlags(ctxt, flags);
    ret = xmlXIncludeDoProcessRoot(ctxt, tree);
    if ((ret >= 0) && (ctxt->nbErrors > 0))
	ret = -1;

    xmlXIncludeFreeContext(ctxt);
    return(ret);
}